

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3RunParser(Parse *pParse,char *zSql,char **pzErrMsg)

{
  Token *pTVar1;
  uchar *z;
  u8 uVar2;
  u8 uVar3;
  sqlite3 *db;
  Table *pTable;
  undefined8 uVar4;
  undefined4 uVar5;
  bool bVar6;
  char **ppcVar7;
  uint uVar8;
  yyParser *pParser;
  char *pcVar9;
  int iVar10;
  AutoincInfo *p;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  Token yyminor;
  Token yyminor_00;
  Token yyminor_01;
  int tokenType;
  char **local_40;
  Token *local_38;
  
  db = pParse->db;
  iVar11 = db->aLimit[1];
  if (db->activeVdbeCnt == 0) {
    (db->u1).isInterrupted = 0;
  }
  pParse->rc = 0;
  pParse->zTail = zSql;
  pParser = (yyParser *)sqlite3Malloc(0xc90);
  if (pParser == (yyParser *)0x0) {
    db->mallocFailed = '\x01';
    return 7;
  }
  pParser->yyidx = -1;
  uVar2 = (db->lookaside).bEnabled;
  if ((db->lookaside).pStart != (void *)0x0) {
    (db->lookaside).bEnabled = '\x01';
  }
  local_38 = &pParse->sLastToken;
  iVar12 = 0;
  local_40 = pzErrMsg;
  iVar13 = -1;
  do {
    uVar3 = db->mallocFailed;
LAB_0011f29c:
    iVar10 = 0;
    bVar6 = true;
    iVar14 = iVar13;
    if ((uVar3 != '\0') || (zSql[iVar12] == '\0')) break;
    z = (uchar *)(zSql + iVar12);
    (pParse->sLastToken).z = (char *)z;
    uVar8 = sqlite3GetToken(z,&tokenType);
    ppcVar7 = local_40;
    iVar14 = tokenType;
    (pParse->sLastToken).n = uVar8;
    iVar12 = iVar12 + uVar8;
    if (iVar11 < iVar12) {
      pParse->rc = 0x12;
      goto LAB_0011f3df;
    }
    if (tokenType == 0x95) goto code_r0x0011f2f6;
    if (tokenType == 1) {
      pParse->zTail = zSql + iVar12;
    }
    else if (tokenType == 0x94) {
      iVar10 = 1;
      sqlite3DbFree(db,*local_40);
      pcVar9 = sqlite3MPrintf(db,"unrecognized token: \"%T\"",local_38);
      *ppcVar7 = pcVar9;
      bVar6 = false;
      iVar14 = iVar13;
      break;
    }
    yyminor.n = uVar8;
    yyminor.z = (char *)z;
    yyminor._12_4_ = 0;
    sqlite3Parser(pParser,tokenType,yyminor,pParse);
    iVar10 = 0;
    bVar6 = true;
    iVar13 = iVar14;
  } while (pParse->rc == 0);
LAB_0011f3e1:
  if (((bVar6) && (zSql[iVar12] == '\0')) && (pParse->rc == 0)) {
    pTVar1 = &pParse->sLastToken;
    pcVar9 = pTVar1->z;
    uVar8 = (pParse->sLastToken).n;
    uVar4 = pTVar1->z;
    uVar5 = pTVar1->n;
    yyminor_00.n = uVar5;
    yyminor_00.z = (char *)uVar4;
    if (iVar14 != 1) {
      yyminor_00._12_4_ = 0;
      sqlite3Parser(pParser,1,yyminor_00,pParse);
      pParse->zTail = zSql + iVar12;
      pcVar9 = (pParse->sLastToken).z;
      uVar8 = (pParse->sLastToken).n;
    }
    yyminor_01.n = uVar8;
    yyminor_01.z = pcVar9;
    yyminor_01._12_4_ = 0;
    sqlite3Parser(pParser,0,yyminor_01,pParse);
  }
  while (-1 < pParser->yyidx) {
    yy_pop_parser_stack(pParser);
  }
  sqlite3_free(pParser);
  (db->lookaside).bEnabled = uVar2;
  if (db->mallocFailed == '\0') {
    iVar11 = pParse->rc;
    if ((iVar11 == 0) || (iVar11 == 0x65)) goto LAB_0011f4a8;
  }
  else {
    pParse->rc = 7;
    iVar11 = 7;
  }
  if (pParse->zErrMsg == (char *)0x0) {
    pcVar9 = sqlite3ErrStr(iVar11);
    sqlite3SetString(&pParse->zErrMsg,db,"%s",pcVar9);
  }
LAB_0011f4a8:
  if (pParse->zErrMsg != (char *)0x0) {
    *local_40 = pParse->zErrMsg;
    sqlite3_log(pParse->rc,"%s");
    pParse->zErrMsg = (char *)0x0;
    iVar10 = iVar10 + 1;
  }
  if (((pParse->pVdbe != (Vdbe *)0x0) && (0 < pParse->nErr)) && (pParse->nested == '\0')) {
    sqlite3VdbeDelete(pParse->pVdbe);
    pParse->pVdbe = (Vdbe *)0x0;
  }
  if (pParse->nested == '\0') {
    sqlite3DbFree(db,pParse->aTableLock);
    pParse->aTableLock = (TableLock *)0x0;
    pParse->nTableLock = 0;
  }
  sqlite3_free(pParse->apVtabLock);
  if (pParse->declareVtab == '\0') {
    sqlite3DeleteTable(db,pParse->pNewTable);
  }
  sqlite3DeleteTrigger(db,pParse->pNewTrigger);
  for (uVar15 = (ulong)(uint)pParse->nzVar; 0 < (int)uVar15; uVar15 = uVar15 - 1) {
    sqlite3DbFree(db,pParse->azVar[uVar15 - 1]);
  }
  sqlite3DbFree(db,pParse->azVar);
  p = (AutoincInfo *)pParse->aAlias;
  while( true ) {
    sqlite3DbFree(db,p);
    p = pParse->pAinc;
    if (p == (AutoincInfo *)0x0) break;
    pParse->pAinc = p->pNext;
  }
  while (pTable = pParse->pZombieTab, pTable != (Table *)0x0) {
    pParse->pZombieTab = pTable->pNextZombie;
    sqlite3DeleteTable(db,pTable);
  }
  if ((iVar10 != 0) && (pParse->rc == 0)) {
    pParse->rc = 1;
  }
  return iVar10;
code_r0x0011f2f6:
  if ((db->u1).isInterrupted != 0) {
    sqlite3ErrorMsg(pParse,"interrupt");
    pParse->rc = 9;
LAB_0011f3df:
    iVar10 = 0;
    bVar6 = true;
    iVar14 = iVar13;
    goto LAB_0011f3e1;
  }
  goto LAB_0011f29c;
}

Assistant:

SQLITE_PRIVATE int sqlite3RunParser(Parse *pParse, const char *zSql, char **pzErrMsg){
  int nErr = 0;                   /* Number of errors encountered */
  int i;                          /* Loop counter */
  void *pEngine;                  /* The LEMON-generated LALR(1) parser */
  int tokenType;                  /* type of the next token */
  int lastTokenParsed = -1;       /* type of the previous token */
  u8 enableLookaside;             /* Saved value of db->lookaside.bEnabled */
  sqlite3 *db = pParse->db;       /* The database connection */
  int mxSqlLen;                   /* Max length of an SQL string */


  mxSqlLen = db->aLimit[SQLITE_LIMIT_SQL_LENGTH];
  if( db->activeVdbeCnt==0 ){
    db->u1.isInterrupted = 0;
  }
  pParse->rc = SQLITE_OK;
  pParse->zTail = zSql;
  i = 0;
  assert( pzErrMsg!=0 );
  pEngine = sqlite3ParserAlloc((void*(*)(size_t))sqlite3Malloc);
  if( pEngine==0 ){
    db->mallocFailed = 1;
    return SQLITE_NOMEM;
  }
  assert( pParse->pNewTable==0 );
  assert( pParse->pNewTrigger==0 );
  assert( pParse->nVar==0 );
  assert( pParse->nzVar==0 );
  assert( pParse->azVar==0 );
  enableLookaside = db->lookaside.bEnabled;
  if( db->lookaside.pStart ) db->lookaside.bEnabled = 1;
  while( !db->mallocFailed && zSql[i]!=0 ){
    assert( i>=0 );
    pParse->sLastToken.z = &zSql[i];
    pParse->sLastToken.n = sqlite3GetToken((unsigned char*)&zSql[i],&tokenType);
    i += pParse->sLastToken.n;
    if( i>mxSqlLen ){
      pParse->rc = SQLITE_TOOBIG;
      break;
    }
    switch( tokenType ){
      case TK_SPACE: {
        if( db->u1.isInterrupted ){
          sqlite3ErrorMsg(pParse, "interrupt");
          pParse->rc = SQLITE_INTERRUPT;
          goto abort_parse;
        }
        break;
      }
      case TK_ILLEGAL: {
        sqlite3DbFree(db, *pzErrMsg);
        *pzErrMsg = sqlite3MPrintf(db, "unrecognized token: \"%T\"",
                        &pParse->sLastToken);
        nErr++;
        goto abort_parse;
      }
      case TK_SEMI: {
        pParse->zTail = &zSql[i];
        /* Fall thru into the default case */
      }
      default: {
        sqlite3Parser(pEngine, tokenType, pParse->sLastToken, pParse);
        lastTokenParsed = tokenType;
        if( pParse->rc!=SQLITE_OK ){
          goto abort_parse;
        }
        break;
      }
    }
  }
abort_parse:
  if( zSql[i]==0 && nErr==0 && pParse->rc==SQLITE_OK ){
    if( lastTokenParsed!=TK_SEMI ){
      sqlite3Parser(pEngine, TK_SEMI, pParse->sLastToken, pParse);
      pParse->zTail = &zSql[i];
    }
    sqlite3Parser(pEngine, 0, pParse->sLastToken, pParse);
  }
#ifdef YYTRACKMAXSTACKDEPTH
  sqlite3StatusSet(SQLITE_STATUS_PARSER_STACK,
      sqlite3ParserStackPeak(pEngine)
  );
#endif /* YYDEBUG */
  sqlite3ParserFree(pEngine, sqlite3_free);
  db->lookaside.bEnabled = enableLookaside;
  if( db->mallocFailed ){
    pParse->rc = SQLITE_NOMEM;
  }
  if( pParse->rc!=SQLITE_OK && pParse->rc!=SQLITE_DONE && pParse->zErrMsg==0 ){
    sqlite3SetString(&pParse->zErrMsg, db, "%s", sqlite3ErrStr(pParse->rc));
  }
  assert( pzErrMsg!=0 );
  if( pParse->zErrMsg ){
    *pzErrMsg = pParse->zErrMsg;
    sqlite3_log(pParse->rc, "%s", *pzErrMsg);
    pParse->zErrMsg = 0;
    nErr++;
  }
  if( pParse->pVdbe && pParse->nErr>0 && pParse->nested==0 ){
    sqlite3VdbeDelete(pParse->pVdbe);
    pParse->pVdbe = 0;
  }
#ifndef SQLITE_OMIT_SHARED_CACHE
  if( pParse->nested==0 ){
    sqlite3DbFree(db, pParse->aTableLock);
    pParse->aTableLock = 0;
    pParse->nTableLock = 0;
  }
#endif
#ifndef SQLITE_OMIT_VIRTUALTABLE
  sqlite3_free(pParse->apVtabLock);
#endif

  if( !IN_DECLARE_VTAB ){
    /* If the pParse->declareVtab flag is set, do not delete any table 
    ** structure built up in pParse->pNewTable. The calling code (see vtab.c)
    ** will take responsibility for freeing the Table structure.
    */
    sqlite3DeleteTable(db, pParse->pNewTable);
  }

  sqlite3DeleteTrigger(db, pParse->pNewTrigger);
  for(i=pParse->nzVar-1; i>=0; i--) sqlite3DbFree(db, pParse->azVar[i]);
  sqlite3DbFree(db, pParse->azVar);
  sqlite3DbFree(db, pParse->aAlias);
  while( pParse->pAinc ){
    AutoincInfo *p = pParse->pAinc;
    pParse->pAinc = p->pNext;
    sqlite3DbFree(db, p);
  }
  while( pParse->pZombieTab ){
    Table *p = pParse->pZombieTab;
    pParse->pZombieTab = p->pNextZombie;
    sqlite3DeleteTable(db, p);
  }
  if( nErr>0 && pParse->rc==SQLITE_OK ){
    pParse->rc = SQLITE_ERROR;
  }
  return nErr;
}